

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
hexedit_reader::perform(hexedit_reader *this,filesystemcollection *fslist,readercollection *rdlist)

{
  uint64_t uVar1;
  bool bVar2;
  undefined8 uVar3;
  size_type sVar4;
  undefined8 *puVar5;
  element_type *peVar6;
  reference pvVar7;
  undefined1 local_30 [8];
  ReadWriter_ptr wr;
  readercollection *rdlist_local;
  filesystemcollection *fslist_local;
  hexedit_reader *this_local;
  
  wr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)rdlist;
  if (1 < g_verbose) {
    uVar3 = std::__cxx11::string::c_str();
    uVar1 = this->_ofs;
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_data);
    printf("dohexedit(%s, %08llx, %08zx)\n",uVar3,uVar1,sVar4);
  }
  readercollection::getbyname
            ((readercollection *)local_30,
             (string *)
             wr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (!bVar2) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "hexedit: invalid rdname";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  peVar6 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  (*peVar6->_vptr_ReadWriter[4])(peVar6,this->_ofs);
  peVar6 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->_data,0);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_data);
  (*peVar6->_vptr_ReadWriter[3])(peVar6,pvVar7,sVar4);
  std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_30);
  return;
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        if (g_verbose>1)
            printf("dohexedit(%s, %08llx, %08zx)\n", _readername.c_str(), _ofs, _data.size());

        ReadWriter_ptr wr= rdlist.getbyname(_readername);
        if (!wr) throw "hexedit: invalid rdname";
        wr->setpos(_ofs);

        wr->write(&_data[0], _data.size());
    }